

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_data_pipelines.cpp
# Opt level: O2

void data_pipeline_3P_SPS(size_t L,uint w)

{
  promise<void> *this;
  Node *pNVar1;
  FlowBuilder FVar2;
  array<tf::DataPipeline<tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:710:68)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:723:60)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:735:59)>_>::Line,_3UL>
  *__cur;
  long lVar3;
  size_t *psVar4;
  long *plVar5;
  pointer p_Var6;
  size_type sVar7;
  size_t sVar8;
  long lVar9;
  int iVar10;
  size_t sVar11;
  ulong uVar12;
  long in_FS_OFFSET;
  bool bVar13;
  __allocator_type __a2;
  shared_ptr<tf::Topology> t;
  anon_class_40_5_fba60c21 local_480;
  atomic<unsigned_long> j2;
  size_t j3;
  size_t j1;
  ulong local_440;
  ulong local_438;
  size_t cnt;
  promise<void> promise;
  vector<int,_std::allocator<int>_> collection;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3e8;
  size_type local_3c8;
  __weak_count<(__gnu_cxx::_Lock_policy)2> _Stack_3c0;
  size_type local_3b8;
  size_t local_3b0;
  Node *local_3a8;
  vector<int,_std::allocator<int>_> source;
  DataPipeline<tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:710:68)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:723:60)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:735:59)>_>
  local_388;
  shared_ptr<tf::WorkerInterface> local_278;
  undefined8 local_268;
  __weak_count<(__gnu_cxx::_Lock_policy)2> _Stack_260;
  mutex mutex;
  Taskflow taskflow;
  Executor executor;
  
  local_278.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_278.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  tf::Executor::Executor(&executor,(ulong)w,&local_278);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_278.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::vector<int,_std::allocator<int>_>::vector(&source,100,(allocator_type *)&local_388);
  iVar10 = 0;
  for (; source.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_start !=
         source.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_finish;
      source.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
           = source.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start + 1) {
    *source.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
         iVar10;
    iVar10 = iVar10 + 1;
  }
  local_438 = L * 0x18;
  local_3b8 = L + 1;
  local_440 = 0;
  local_3b0 = L;
  while( true ) {
    if (100 < local_440) {
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&source.super__Vector_base<int,_std::allocator<int>_>);
      tf::Executor::~Executor(&executor);
      return;
    }
    tf::Taskflow::Taskflow(&taskflow);
    sVar11 = local_3b0;
    j1 = 0;
    j3 = 0;
    j2.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0;
    mutex.super___mutex_base._M_mutex._16_8_ = 0;
    mutex.super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
    mutex.super___mutex_base._M_mutex.__align = 0;
    mutex.super___mutex_base._M_mutex._8_8_ = 0;
    mutex.super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
    collection.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    collection.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    collection.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    cnt = 1;
    local_388._graph.
    super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    .
    super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_388._graph.
    super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    .
    super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_388._graph.
    super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    .
    super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_388._pipes.
    super__Tuple_impl<0UL,_tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:710:68)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:723:60)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:735:59)>_>
    .
    super__Tuple_impl<1UL,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:723:60)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:735:59)>_>
    .
    super__Tuple_impl<2UL,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:735:59)>_>
    .
    super__Head_base<2UL,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:735:59)>,_false>
    ._M_head_impl._type = SERIAL;
    local_388._pipes.
    super__Tuple_impl<0UL,_tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:710:68)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:723:60)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:735:59)>_>
    .
    super__Tuple_impl<1UL,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:723:60)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:735:59)>_>
    .
    super__Tuple_impl<2UL,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:735:59)>_>
    .
    super__Head_base<2UL,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:735:59)>,_false>
    ._M_head_impl._callable.N = local_440;
    local_388._pipes.
    super__Tuple_impl<0UL,_tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:710:68)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:723:60)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:735:59)>_>
    .
    super__Tuple_impl<1UL,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:723:60)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:735:59)>_>
    .
    super__Tuple_impl<2UL,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:735:59)>_>
    .
    super__Head_base<2UL,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:735:59)>,_false>
    ._M_head_impl._callable.source = &source;
    local_388._pipes.
    super__Tuple_impl<0UL,_tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:710:68)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:723:60)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:735:59)>_>
    .
    super__Tuple_impl<1UL,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:723:60)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:735:59)>_>
    .
    super__Tuple_impl<2UL,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:735:59)>_>
    .
    super__Head_base<2UL,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:735:59)>,_false>
    ._M_head_impl._callable.j3 = &j3;
    local_388._pipes.
    super__Tuple_impl<0UL,_tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:710:68)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:723:60)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:735:59)>_>
    .
    super__Tuple_impl<1UL,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:723:60)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:735:59)>_>
    .
    super__Tuple_impl<2UL,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:735:59)>_>
    .
    super__Head_base<2UL,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:735:59)>,_false>
    ._M_head_impl._callable.L = local_3b0;
    local_388._pipes.
    super__Tuple_impl<0UL,_tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:710:68)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:723:60)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:735:59)>_>
    .
    super__Tuple_impl<1UL,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:723:60)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:735:59)>_>
    .
    super__Head_base<1UL,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:723:60)>,_false>
    ._M_head_impl._type = PARALLEL;
    local_388._pipes.
    super__Tuple_impl<0UL,_tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:710:68)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:723:60)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:735:59)>_>
    .
    super__Tuple_impl<1UL,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:723:60)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:735:59)>_>
    .
    super__Head_base<1UL,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:723:60)>,_false>
    ._M_head_impl._callable.N = local_440;
    local_388._pipes.
    super__Tuple_impl<0UL,_tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:710:68)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:723:60)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:735:59)>_>
    .
    super__Tuple_impl<1UL,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:723:60)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:735:59)>_>
    .
    super__Head_base<1UL,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:723:60)>,_false>
    ._M_head_impl._callable.j2 = &j2;
    local_388._pipes.
    super__Tuple_impl<0UL,_tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:710:68)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:723:60)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:735:59)>_>
    .
    super__Tuple_impl<1UL,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:723:60)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:735:59)>_>
    .
    super__Head_base<1UL,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:723:60)>,_false>
    ._M_head_impl._callable.mutex = &mutex;
    local_388._pipes.
    super__Tuple_impl<0UL,_tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:710:68)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:723:60)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:735:59)>_>
    .
    super__Tuple_impl<1UL,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:723:60)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:735:59)>_>
    .
    super__Head_base<1UL,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:723:60)>,_false>
    ._M_head_impl._callable.L = local_3b0;
    local_388._pipes.
    super__Tuple_impl<0UL,_tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:710:68)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:723:60)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:735:59)>_>
    .
    super__Head_base<0UL,_tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:710:68)>,_false>
    ._M_head_impl._callable.N = local_440;
    local_388._pipes.
    super__Tuple_impl<0UL,_tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:710:68)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:723:60)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:735:59)>_>
    .
    super__Head_base<0UL,_tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:710:68)>,_false>
    ._M_head_impl._callable.j1 = &j1;
    local_388._pipes.
    super__Tuple_impl<0UL,_tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:710:68)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:723:60)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:735:59)>_>
    .
    super__Head_base<0UL,_tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:710:68)>,_false>
    ._M_head_impl._callable.L = local_3b0;
    local_388._meta._M_elems[0].type = SERIAL;
    local_388._meta._M_elems[1].type = PARALLEL;
    local_388._pipes.
    super__Tuple_impl<0UL,_tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:710:68)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:723:60)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:735:59)>_>
    .
    super__Tuple_impl<1UL,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:723:60)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:735:59)>_>
    .
    super__Head_base<1UL,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:723:60)>,_false>
    ._M_head_impl._callable.collection = &collection;
    local_388._pipes.
    super__Tuple_impl<0UL,_tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:710:68)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:723:60)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:735:59)>_>
    .
    super__Head_base<0UL,_tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:710:68)>,_false>
    ._M_head_impl._type =
         local_388._pipes.
         super__Tuple_impl<0UL,_tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:710:68)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:723:60)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:735:59)>_>
         .
         super__Tuple_impl<1UL,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:723:60)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:735:59)>_>
         .
         super__Tuple_impl<2UL,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:735:59)>_>
         .
         super__Head_base<2UL,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:735:59)>,_false>
         ._M_head_impl._type;
    local_388._pipes.
    super__Tuple_impl<0UL,_tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:710:68)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:723:60)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:735:59)>_>
    .
    super__Head_base<0UL,_tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:710:68)>,_false>
    ._M_head_impl._callable.source =
         local_388._pipes.
         super__Tuple_impl<0UL,_tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:710:68)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:723:60)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:735:59)>_>
         .
         super__Tuple_impl<1UL,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:723:60)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:735:59)>_>
         .
         super__Tuple_impl<2UL,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:735:59)>_>
         .
         super__Head_base<2UL,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:735:59)>,_false>
         ._M_head_impl._callable.source;
    local_388._meta._M_elems[2].type =
         local_388._pipes.
         super__Tuple_impl<0UL,_tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:710:68)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:723:60)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:735:59)>_>
         .
         super__Tuple_impl<1UL,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:723:60)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:735:59)>_>
         .
         super__Tuple_impl<2UL,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:735:59)>_>
         .
         super__Head_base<2UL,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:735:59)>,_false>
         ._M_head_impl._type;
    if (0x555555555555555 < local_3b0) break;
    local_388._lines.
    super__Vector_base<std::array<tf::DataPipeline<tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:710:68)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:723:60)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:735:59)>_>::Line,_3UL>,_std::allocator<std::array<tf::DataPipeline<tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:710:68)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:723:60)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:735:59)>_>::Line,_3UL>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_388._lines.
    super__Vector_base<std::array<tf::DataPipeline<tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:710:68)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:723:60)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:735:59)>_>::Line,_3UL>,_std::allocator<std::array<tf::DataPipeline<tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:710:68)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:723:60)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:735:59)>_>::Line,_3UL>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_388._lines.
    super__Vector_base<std::array<tf::DataPipeline<tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:710:68)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:723:60)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:735:59)>_>::Line,_3UL>,_std::allocator<std::array<tf::DataPipeline<tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:710:68)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:723:60)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:735:59)>_>::Line,_3UL>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    if (local_3b0 == 0) {
      local_388._lines.
      super__Vector_base<std::array<tf::DataPipeline<tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:710:68)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:723:60)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:735:59)>_>::Line,_3UL>,_std::allocator<std::array<tf::DataPipeline<tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:710:68)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:723:60)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:735:59)>_>::Line,_3UL>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    }
    else {
      local_388._lines.
      super__Vector_base<std::array<tf::DataPipeline<tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:710:68)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:723:60)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:735:59)>_>::Line,_3UL>,_std::allocator<std::array<tf::DataPipeline<tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:710:68)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:723:60)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:735:59)>_>::Line,_3UL>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)operator_new(local_438);
    }
    local_388._lines.
    super__Vector_base<std::array<tf::DataPipeline<tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:710:68)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:723:60)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:735:59)>_>::Line,_3UL>,_std::allocator<std::array<tf::DataPipeline<tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:710:68)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:723:60)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:735:59)>_>::Line,_3UL>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)((long)&(local_388._lines.
                           super__Vector_base<std::array<tf::DataPipeline<tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:710:68)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:723:60)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:735:59)>_>::Line,_3UL>,_std::allocator<std::array<tf::DataPipeline<tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:710:68)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:723:60)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:735:59)>_>::Line,_3UL>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->_M_elems[0].join_counter.
                          super___atomic_base<unsigned_long>._M_i + local_438);
    local_388._lines.
    super__Vector_base<std::array<tf::DataPipeline<tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:710:68)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:723:60)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:735:59)>_>::Line,_3UL>,_std::allocator<std::array<tf::DataPipeline<tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:710:68)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:723:60)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:735:59)>_>::Line,_3UL>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         local_388._lines.
         super__Vector_base<std::array<tf::DataPipeline<tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:710:68)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:723:60)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:735:59)>_>::Line,_3UL>,_std::allocator<std::array<tf::DataPipeline<tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:710:68)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:723:60)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:735:59)>_>::Line,_3UL>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    sVar8 = sVar11;
    while (bVar13 = sVar8 != 0, sVar8 = sVar8 - 1, bVar13) {
      (local_388._lines.
       super__Vector_base<std::array<tf::DataPipeline<tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:710:68)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:723:60)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:735:59)>_>::Line,_3UL>,_std::allocator<std::array<tf::DataPipeline<tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:710:68)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:723:60)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:735:59)>_>::Line,_3UL>_>_>
       ._M_impl.super__Vector_impl_data._M_finish)->_M_elems[0].join_counter.
      super___atomic_base<unsigned_long>._M_i = 0;
      (local_388._lines.
       super__Vector_base<std::array<tf::DataPipeline<tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:710:68)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:723:60)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:735:59)>_>::Line,_3UL>,_std::allocator<std::array<tf::DataPipeline<tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:710:68)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:723:60)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:735:59)>_>::Line,_3UL>_>_>
       ._M_impl.super__Vector_impl_data._M_finish)->_M_elems[1].join_counter.
      super___atomic_base<unsigned_long>._M_i = 0;
      (local_388._lines.
       super__Vector_base<std::array<tf::DataPipeline<tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:710:68)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:723:60)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:735:59)>_>::Line,_3UL>,_std::allocator<std::array<tf::DataPipeline<tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:710:68)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:723:60)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:735:59)>_>::Line,_3UL>_>_>
       ._M_impl.super__Vector_impl_data._M_finish)->_M_elems[2].join_counter.
      super___atomic_base<unsigned_long>._M_i = 0;
      local_388._lines.
      super__Vector_base<std::array<tf::DataPipeline<tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:710:68)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:723:60)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:735:59)>_>::Line,_3UL>,_std::allocator<std::array<tf::DataPipeline<tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:710:68)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:723:60)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:735:59)>_>::Line,_3UL>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           local_388._lines.
           super__Vector_base<std::array<tf::DataPipeline<tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:710:68)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:723:60)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:735:59)>_>::Line,_3UL>,_std::allocator<std::array<tf::DataPipeline<tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:710:68)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:723:60)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:735:59)>_>::Line,_3UL>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + 1;
    }
    std::vector<tf::Task,_std::allocator<tf::Task>_>::vector
              (&local_388._tasks,local_3b8,(allocator_type *)&local_480);
    std::vector<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>::vector
              (&local_388._pipeflows,sVar11,(allocator_type *)&local_480);
    std::
    vector<tf::CachelineAligned<std::variant<int,_std::monostate>_>,_std::allocator<tf::CachelineAligned<std::variant<int,_std::monostate>_>_>_>
    ::vector(&local_388._buffer,sVar11,(allocator_type *)&local_480);
    if (sVar11 == 0) {
      tf::throw_re<char_const(&)[28]>
                ("/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/taskflow/algorithm/data_pipeline.hpp"
                 ,0x180,(char (*) [28])"must have at least one line");
    }
    if (local_388._pipes.
        super__Tuple_impl<0UL,_tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:710:68)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:723:60)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:735:59)>_>
        .
        super__Head_base<0UL,_tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:710:68)>,_false>
        ._M_head_impl._type != SERIAL) {
      tf::throw_re<char_const(&)[26]>
                ("/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/taskflow/algorithm/data_pipeline.hpp"
                 ,0x184,(char (*) [26])"first pipe must be serial");
    }
    local_388._num_tokens = 0;
    psVar4 = &(local_388._pipeflows.super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>.
               _M_impl.super__Vector_impl_data._M_start)->_pipe;
    for (sVar11 = 0;
        ((long)local_388._pipeflows.super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>.
               _M_impl.super__Vector_impl_data._M_finish -
        (long)local_388._pipeflows.super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>.
              _M_impl.super__Vector_impl_data._M_start) / 0x60 != sVar11; sVar11 = sVar11 + 1) {
      *psVar4 = 0;
      ((Pipeflow *)(psVar4 + -1))->_line = sVar11;
      psVar4 = psVar4 + 0xc;
    }
    (local_388._lines.
     super__Vector_base<std::array<tf::DataPipeline<tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:710:68)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:723:60)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:735:59)>_>::Line,_3UL>,_std::allocator<std::array<tf::DataPipeline<tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:710:68)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:723:60)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:735:59)>_>::Line,_3UL>_>_>
     ._M_impl.super__Vector_impl_data._M_start)->_M_elems[0].join_counter.
    super___atomic_base<unsigned_long>._M_i = 0;
    lVar9 = 0x20;
    for (uVar12 = 1;
        uVar12 < (ulong)(((long)local_388._pipeflows.
                                super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)local_388._pipeflows.
                               super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>.
                               _M_impl.super__Vector_impl_data._M_start) / 0x60);
        uVar12 = uVar12 + 1) {
      for (lVar3 = 0; lVar3 != 2; lVar3 = lVar3 + 1) {
        *(long *)((long)&(local_388._lines.
                          super__Vector_base<std::array<tf::DataPipeline<tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:710:68)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:723:60)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:735:59)>_>::Line,_3UL>,_std::allocator<std::array<tf::DataPipeline<tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:710:68)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:723:60)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:735:59)>_>::Line,_3UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->_M_elems[lVar3].join_counter.
                         super___atomic_base<unsigned_long>._M_i + lVar9) =
             (long)(int)local_388._meta._M_elems[lVar3 + 1].type;
      }
      lVar9 = lVar9 + 0x18;
    }
    for (lVar9 = 0; lVar9 != 2; lVar9 = lVar9 + 1) {
      (local_388._lines.
       super__Vector_base<std::array<tf::DataPipeline<tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:710:68)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:723:60)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:735:59)>_>::Line,_3UL>,_std::allocator<std::array<tf::DataPipeline<tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:710:68)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:723:60)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:735:59)>_>::Line,_3UL>_>_>
       ._M_impl.super__Vector_impl_data._M_start)->_M_elems[lVar9 + 1].join_counter.
      super___atomic_base<unsigned_long>._M_i = 1;
    }
    lVar9 = 0x18;
    for (uVar12 = 1;
        uVar12 < (ulong)(((long)local_388._pipeflows.
                                super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)local_388._pipeflows.
                               super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>.
                               _M_impl.super__Vector_impl_data._M_start) / 0x60);
        uVar12 = uVar12 + 1) {
      *(long *)((long)&(local_388._lines.
                        super__Vector_base<std::array<tf::DataPipeline<tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:710:68)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:723:60)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:735:59)>_>::Line,_3UL>,_std::allocator<std::array<tf::DataPipeline<tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:710:68)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:723:60)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:735:59)>_>::Line,_3UL>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->_M_elems[0].join_counter.
                       super___atomic_base<unsigned_long>._M_i + lVar9) =
           (long)(int)local_388._meta._M_elems[0].type + -1;
      lVar9 = lVar9 + 0x18;
    }
    local_480.j1 = (size_t *)operator_new(0xd8);
    *local_480.j1 = 0;
    local_480.j1[1] = (size_t)(local_480.j1 + 3);
    local_480.j1[2] = 0;
    *(undefined1 *)(local_480.j1 + 3) = 0;
    local_480.j1[5] = 0;
    local_480.j1[6] = 0;
    local_480.j1[7] = 0;
    local_480.j1[8] = 0;
    local_480.j1[9] = (size_t)(local_480.j1 + 0xc);
    local_480.j1[10] = (size_t)(local_480.j1 + 0xc);
    local_480.j1[0xb] = (size_t)(local_480.j1 + 0x10);
    local_480.j1[0x10] = 0;
    local_480.j1[0x12] = 0;
    local_480.j1[0x11] = (size_t)&local_388;
    local_480.j1[0x14] =
         (size_t)std::
                 _Function_handler<int_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/taskflow/algorithm/data_pipeline.hpp:545:26)>
                 ::_M_invoke;
    local_480.j1[0x13] =
         (size_t)std::
                 _Function_handler<int_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/taskflow/algorithm/data_pipeline.hpp:545:26)>
                 ::_M_manager;
    *(undefined1 *)(local_480.j1 + 0x18) = 4;
    local_480.j1[0x19] = 0;
    local_480.j1[0x1a] = 0;
    std::
    vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
    ::emplace_back<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>
              ((vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
                *)&local_388,(unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_480);
    std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>::~unique_ptr
              ((unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_480);
    pNVar1 = local_388._graph.
             super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
             .
             super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
             super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
             super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
             super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_480,"cond",(allocator<char> *)&local_3e8);
    std::__cxx11::string::_M_assign((string *)&pNVar1->_name);
    (local_388._tasks.super__Vector_base<tf::Task,_std::allocator<tf::Task>_>._M_impl.
     super__Vector_impl_data._M_start)->_node = pNVar1;
    std::__cxx11::string::~string((string *)&local_480);
    for (uVar12 = 0; FVar2._graph = taskflow.super_FlowBuilder._graph,
        uVar12 < (ulong)(((long)local_388._pipeflows.
                                super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)local_388._pipeflows.
                               super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>.
                               _M_impl.super__Vector_impl_data._M_start) / 0x60);
        uVar12 = uVar12 + 1) {
      local_480.j1 = (size_t *)operator_new(0xd8);
      *local_480.j1 = 0;
      local_480.j1[1] = (size_t)(local_480.j1 + 3);
      local_480.j1[2] = 0;
      *(undefined1 *)(local_480.j1 + 3) = 0;
      local_480.j1[5] = 0;
      local_480.j1[6] = 0;
      local_480.j1[7] = 0;
      local_480.j1[8] = 0;
      local_480.j1[9] = (size_t)(local_480.j1 + 0xc);
      local_480.j1[10] = (size_t)(local_480.j1 + 0xc);
      local_480.j1[0xb] = (size_t)(local_480.j1 + 0x10);
      local_480.j1[0x10] = 0;
      local_480.j1[0x11] = (size_t)&local_388;
      local_480.j1[0x12] = uVar12;
      local_480.j1[0x14] =
           (size_t)std::
                   _Function_handler<void_(tf::Runtime_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/taskflow/algorithm/data_pipeline.hpp:552:32)>
                   ::_M_invoke;
      local_480.j1[0x13] =
           (size_t)std::
                   _Function_handler<void_(tf::Runtime_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/taskflow/algorithm/data_pipeline.hpp:552:32)>
                   ::_M_manager;
      *(undefined1 *)(local_480.j1 + 0x18) = 2;
      local_480.j1[0x19] = 0;
      local_480.j1[0x1a] = 0;
      std::
      vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
      ::emplace_back<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>
                ((vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
                  *)&local_388,(unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_480);
      std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>::~unique_ptr
                ((unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_480);
      pNVar1 = local_388._graph.
               super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
               .
               super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
               super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
               super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
               super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl;
      s_abi_cxx11_(&local_3e8,"rt-",3);
      std::__cxx11::to_string((string *)&promise,uVar12);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_480
                     ,&local_3e8,(string *)&promise);
      std::__cxx11::string::_M_assign((string *)&pNVar1->_name);
      local_388._tasks.super__Vector_base<tf::Task,_std::allocator<tf::Task>_>._M_impl.
      super__Vector_impl_data._M_start[uVar12 + 1]._node = pNVar1;
      std::__cxx11::string::~string((string *)&local_480);
      std::__cxx11::string::~string((string *)&promise);
      std::__cxx11::string::~string((string *)&local_3e8);
      tf::Task::precede<tf::Task&>
                (local_388._tasks.super__Vector_base<tf::Task,_std::allocator<tf::Task>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 local_388._tasks.super__Vector_base<tf::Task,_std::allocator<tf::Task>_>._M_impl.
                 super__Vector_impl_data._M_start + uVar12 + 1);
    }
    local_480.j1 = (size_t *)operator_new(0xd8);
    *local_480.j1 = 0;
    local_480.j1[1] = (size_t)(local_480.j1 + 3);
    local_480.j1[2] = 0;
    *(undefined1 *)(local_480.j1 + 3) = 0;
    local_480.j1[5] = 0;
    local_480.j1[6] = 0;
    local_480.j1[7] = 0;
    local_480.j1[8] = 0;
    local_480.j1[9] = (size_t)(local_480.j1 + 0xc);
    local_480.j1[10] = (size_t)(local_480.j1 + 0xc);
    local_480.j1[0xb] = (size_t)(local_480.j1 + 0x10);
    local_480.j1[0x10] = 0;
    local_480.j1[0x11] = (size_t)&local_388;
    *(undefined1 *)(local_480.j1 + 0x18) = 6;
    local_480.j1[0x19] = 0;
    local_480.j1[0x1a] = 0;
    std::
    vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
    ::emplace_back<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>
              ((vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
                *)FVar2._graph,(unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_480);
    std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>::~unique_ptr
              ((unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_480);
    pNVar1 = ((FVar2._graph)->
             super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
             ).
             super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
             super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
             super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
             super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_480,"module_of_datapipeline",(allocator<char> *)&local_3e8);
    std::__cxx11::string::_M_assign((string *)&pNVar1->_name);
    local_3a8 = pNVar1;
    std::__cxx11::string::~string((string *)&local_480);
    FVar2 = taskflow.super_FlowBuilder;
    psVar4 = (size_t *)operator_new(0xd8);
    *psVar4 = 0;
    psVar4[1] = (size_t)(psVar4 + 3);
    psVar4[2] = 0;
    *(undefined1 *)(psVar4 + 3) = 0;
    psVar4[5] = 0;
    psVar4[6] = 0;
    psVar4[7] = 0;
    psVar4[8] = 0;
    psVar4[9] = (size_t)(psVar4 + 0xc);
    psVar4[10] = (size_t)(psVar4 + 0xc);
    psVar4[0xb] = (size_t)(psVar4 + 0x10);
    psVar4[0x10] = 0;
    psVar4[0x11] = 0;
    psVar4[0x12] = 0;
    psVar4[0x13] = 0;
    psVar4[0x14] = 0;
    plVar5 = (long *)operator_new(0x38);
    *plVar5 = (long)&j1;
    plVar5[1] = (long)&local_440;
    plVar5[2] = (long)&j2;
    plVar5[3] = (long)&j3;
    plVar5[4] = (long)&collection;
    plVar5[5] = (long)&local_388;
    plVar5[6] = (long)&cnt;
    psVar4[0x11] = (size_t)plVar5;
    psVar4[0x14] = (size_t)std::
                           _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_data_pipelines.cpp:744:34)>
                           ::_M_invoke;
    psVar4[0x13] = (size_t)std::
                           _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_data_pipelines.cpp:744:34)>
                           ::_M_manager;
    *(undefined1 *)(psVar4 + 0x18) = 1;
    psVar4[0x19] = 0;
    psVar4[0x1a] = 0;
    local_480.j1 = psVar4;
    std::
    vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
    ::emplace_back<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>
              ((vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
                *)FVar2._graph,(unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_480);
    std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>::~unique_ptr
              ((unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_480);
    pNVar1 = ((FVar2._graph)->
             super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
             ).
             super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
             super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
             super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
             super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_480,"test",(allocator<char> *)&local_3e8);
    std::__cxx11::string::_M_assign((string *)&pNVar1->_name);
    std::__cxx11::string::~string((string *)&local_480);
    tf::Node::_precede(local_3a8,pNVar1);
    local_480.j1 = &j1;
    local_480.j2 = &j2;
    local_480.j3 = &j3;
    local_480.cnt = &cnt;
    local_480.collection = &collection;
    tf::Executor::_increment_topology(&executor);
    if (taskflow._graph.
        super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
        .
        super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        taskflow._graph.
        super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
        .
        super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      data_pipeline_3P_SPS::anon_class_40_5_fba60c21::operator()(&local_480);
      std::promise<void>::promise(&promise);
      std::promise<void>::set_value(&promise);
      tf::Executor::_decrement_topology(&executor);
      std::__basic_future<void>::__basic_future((__basic_future<void> *)&t,(__state_type *)&promise)
      ;
      local_3e8._M_dataplus._M_p =
           (pointer)t.super___shared_ptr<tf::Topology,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_3e8._M_string_length =
           (size_type)
           t.super___shared_ptr<tf::Topology,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      t.super___shared_ptr<tf::Topology,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
      t.super___shared_ptr<tf::Topology,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_3e8.field_2._M_allocated_capacity = 0;
      local_3e8.field_2._8_8_ = 0;
      local_268 = 0;
      _Stack_260._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count(&_Stack_260);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&t.super___shared_ptr<tf::Topology,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      std::promise<void>::~promise(&promise);
    }
    else {
      t.super___shared_ptr<tf::Topology,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
      p_Var6 = std::
               allocator_traits<std::allocator<std::_Sp_counted_ptr_inplace<tf::Topology,_std::allocator<tf::Topology>,_(__gnu_cxx::_Lock_policy)2>_>_>
               ::allocate(&__a2,1);
      promise._M_future.
      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)&__a2;
      (p_Var6->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._M_use_count = 1;
      (p_Var6->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._M_weak_count = 1;
      (p_Var6->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._vptr__Sp_counted_base =
           (_func_int **)&PTR___Sp_counted_ptr_inplace_00171cb0;
      (p_Var6->_M_impl)._M_storage._M_storage.__align =
           (anon_struct_8_0_00000001_for___align)&taskflow;
      this = (promise<void> *)((long)&(p_Var6->_M_impl)._M_storage._M_storage + 8);
      promise._M_future.
      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = &p_Var6->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>;
      std::promise<void>::promise(this);
      *(undefined8 *)((long)&(p_Var6->_M_impl)._M_storage._M_storage + 0x28) = 0;
      *(undefined8 *)((long)&(p_Var6->_M_impl)._M_storage._M_storage + 0x20) = 2;
      *(code **)((long)&(p_Var6->_M_impl)._M_storage._M_storage + 0x38) =
           std::
           _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/taskflow/core/executor.hpp:2003:8)>
           ::_M_invoke;
      *(code **)((long)&(p_Var6->_M_impl)._M_storage._M_storage + 0x30) =
           std::
           _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/taskflow/core/executor.hpp:2003:8)>
           ::_M_manager;
      *(undefined8 *)((long)&(p_Var6->_M_impl)._M_storage._M_storage + 0x40) = 0;
      *(undefined8 *)((long)&(p_Var6->_M_impl)._M_storage._M_storage + 0x48) = 0;
      *(undefined8 *)((long)&(p_Var6->_M_impl)._M_storage._M_storage + 0x50) = 0;
      *(undefined8 *)((long)&(p_Var6->_M_impl)._M_storage._M_storage + 0x58) = 0;
      plVar5 = (long *)operator_new(0x28);
      plVar5[4] = (long)local_480.cnt;
      plVar5[2] = (long)local_480.j3;
      plVar5[3] = (long)local_480.collection;
      *plVar5 = (long)local_480.j1;
      plVar5[1] = (long)local_480.j2;
      *(long **)((long)&(p_Var6->_M_impl)._M_storage._M_storage + 0x40) = plVar5;
      *(code **)((long)&(p_Var6->_M_impl)._M_storage._M_storage + 0x58) =
           std::
           _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_data_pipelines.cpp:760:33)>
           ::_M_invoke;
      *(code **)((long)&(p_Var6->_M_impl)._M_storage._M_storage + 0x50) =
           std::
           _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_data_pipelines.cpp:760:33)>
           ::_M_manager;
      *(undefined8 *)((long)&(p_Var6->_M_impl)._M_storage._M_storage + 0x60) = 0;
      *(undefined4 *)((long)&(p_Var6->_M_impl)._M_storage._M_storage + 0x68) = 0;
      *(undefined8 *)((long)&(p_Var6->_M_impl)._M_storage._M_storage + 0x70) = 0;
      promise._M_future.
      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      t.super___shared_ptr<tf::Topology,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)&p_Var6->_M_impl;
      t.super___shared_ptr<tf::Topology,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           &p_Var6->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>;
      std::
      __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<tf::Topology,_std::allocator<tf::Topology>,_(__gnu_cxx::_Lock_policy)2>_>_>
      ::~__allocated_ptr((__allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<tf::Topology,_std::allocator<tf::Topology>,_(__gnu_cxx::_Lock_policy)2>_>_>
                          *)&promise);
      std::__basic_future<void>::__basic_future
                ((__basic_future<void> *)&promise,(__state_type *)this);
      std::__weak_ptr<tf::Topology,(__gnu_cxx::_Lock_policy)2>::__weak_ptr<tf::Topology,void>
                ((__weak_ptr<tf::Topology,(__gnu_cxx::_Lock_policy)2> *)&local_3c8,
                 &t.super___shared_ptr<tf::Topology,_(__gnu_cxx::_Lock_policy)2>);
      local_3e8._M_dataplus._M_p =
           (pointer)promise._M_future.
                    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr;
      local_3e8._M_string_length =
           (size_type)
           promise._M_future.
           super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
      promise._M_future.
      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      promise._M_future.
      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_3e8.field_2._M_allocated_capacity = local_3c8;
      local_3e8.field_2._8_8_ = _Stack_3c0._M_pi;
      local_3c8 = 0;
      _Stack_3c0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count(&_Stack_3c0);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&promise._M_future.
                  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::mutex::lock(&taskflow._mutex);
      std::deque<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>::
      push_back(&taskflow._topologies.c,
                (value_type *)&t.super___shared_ptr<tf::Topology,_(__gnu_cxx::_Lock_policy)2>);
      sVar7 = std::
              deque<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>
              ::size(&taskflow._topologies.c);
      if (sVar7 == 1) {
        tf::Executor::_set_up_topology
                  (&executor,*(Worker **)(in_FS_OFFSET + -8),
                   t.super___shared_ptr<tf::Topology,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      }
      pthread_mutex_unlock((pthread_mutex_t *)&taskflow._mutex);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&t.super___shared_ptr<tf::Topology,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    }
    std::future<void>::get((future<void> *)&local_3e8);
    tf::Future<void>::~Future((Future<void> *)&local_3e8);
    tf::
    DataPipeline<tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_data_pipelines.cpp:710:68)>,_tf::DataPipe<int,_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_data_pipelines.cpp:723:60)>,_tf::DataPipe<int,_void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_data_pipelines.cpp:735:59)>_>
    ::~DataPipeline(&local_388);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&collection.super__Vector_base<int,_std::allocator<int>_>);
    tf::Taskflow::~Taskflow(&taskflow);
    local_440 = local_440 + 1;
  }
  std::__throw_length_error("cannot create std::vector larger than max_size()");
}

Assistant:

void data_pipeline_3P_SPS(size_t L, unsigned w) {

  tf::Executor executor(w);

  const size_t maxN = 100;

  std::vector<int> source(maxN);
  std::iota(source.begin(), source.end(), 0);
  // std::vector<std::array<int, 3>> mybuffer(L);

  for(size_t N = 0; N <= maxN; N++) {

    tf::Taskflow taskflow;

    size_t j1 = 0, j3 = 0;
    std::atomic<size_t> j2 = 0;
    std::mutex mutex;
    std::vector<int> collection;
    size_t cnt = 1;

    tf::DataPipeline pl(L,
      tf::make_data_pipe<tf::Pipeflow&, int>(tf::PipeType::SERIAL, [N, &source, &j1, L](tf::Pipeflow& pf) mutable {
        if(j1 == N) {
          pf.stop();
          return 0;
        }
        REQUIRE(j1 == source[j1]);
        REQUIRE(pf.token() % L == pf.line());
        //*(pf.output()) = source[j1] + 1;
        // mybuffer[pf.line()][pf.pipe()] = source[j1] + 1;
        // j1++;
        return source[j1++] + 1;
      }),

      tf::make_data_pipe<int, int>(tf::PipeType::PARALLEL, [N, &j2, &mutex, &collection, L](int input, tf::Pipeflow& pf) mutable {
        REQUIRE(j2++ < N);
        //*(pf.output()) = *(pf.input()) + 1;
        {
          std::scoped_lock<std::mutex> lock(mutex);
          // mybuffer[pf.line()][pf.pipe()] = mybuffer[pf.line()][pf.pipe() - 1] + 1;
          REQUIRE(pf.token() % L == pf.line());
          collection.push_back(input);
          return input + 1;
        }
      }),

      tf::make_data_pipe<int, void>(tf::PipeType::SERIAL, [N, &source, &j3, L](int input, tf::Pipeflow& pf) mutable {
        REQUIRE(j3 < N);
        REQUIRE(pf.token() % L == pf.line());
        REQUIRE(source[j3] + 2 == input);
        j3++;
      })
    );

    auto datapipeline = taskflow.composed_of(pl).name("module_of_datapipeline");
    auto test = taskflow.emplace([&](){
      REQUIRE(j1 == N);
      REQUIRE(j2 == N);
      REQUIRE(j3 == N);
      REQUIRE(collection.size() == N);

      std::sort(collection.begin(), collection.end());
      for (size_t i = 0; i < N; ++i) {
        REQUIRE(collection[i] == i + 1);
      }
      REQUIRE(pl.num_tokens() == cnt * N);

    }).name("test");

    datapipeline.precede(test);

    executor.run_n(taskflow, 3, [&]() mutable {
      j1 = j2 = j3 = 0;
      collection.clear();
      // for(size_t i = 0; i < mybuffer.size(); ++i){
      //   for(size_t j = 0; j < mybuffer[0].size(); ++j){
      //     mybuffer[i][j] = 0;
      //   }
      // }

      cnt++;
    }).get();
  }
}